

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O2

void __thiscall
markdown::token::BoldOrItalicMarker::writeAsHtml(BoldOrItalicMarker *this,ostream *out)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (this->mDisabled == false) {
    if (this->mMatch != (BoldOrItalicMarker *)0x0) {
      sVar1 = this->mSize;
      if (sVar1 - 1 < 3) {
        if (this->mOpenMarker == true) {
          pcVar2 = "<strong><em>";
          if (sVar1 == 2) {
            pcVar2 = "<strong>";
          }
          pcVar3 = "<em>";
        }
        else {
          pcVar2 = "</em></strong>";
          if (sVar1 == 2) {
            pcVar2 = "</strong>";
          }
          pcVar3 = "</em>";
        }
        if (sVar1 != 1) {
          pcVar3 = pcVar2;
        }
        std::operator<<(out,pcVar3);
        return;
      }
      __assert_fail("mSize>=1 && mSize<=3",
                    "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                    ,0x2e4,
                    "virtual void markdown::token::BoldOrItalicMarker::writeAsHtml(std::ostream &) const"
                   );
    }
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct((ulong)local_30,(char)this->mSize);
    std::operator<<(out,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void BoldOrItalicMarker::writeAsHtml(std::ostream& out) const {
	if (!mDisabled) {
		if (mMatch!=0) {
			assert(mSize>=1 && mSize<=3);
			if (mOpenMarker) {
				out << (mSize==1 ? "<em>" : mSize==2 ? "<strong>" : "<strong><em>");
			} else {
				out << (mSize==1 ? "</em>" : mSize==2 ? "</strong>" : "</em></strong>");
			}
		} else out << std::string(mSize, mTokenCharacter);
	}
}